

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::documentation::documentation
          (documentation *this,group *cli,doc_formatting *fmt,filter_function *filter)

{
  int iVar1;
  int iVar2;
  
  this->cli_ = cli;
  doc_formatting::doc_formatting(&this->fmt_,fmt);
  doc_formatting::doc_formatting(&this->usgFmt_,fmt);
  std::function<bool_(const_clipp::parameter_&)>::function(&this->filter_,filter);
  iVar1 = (this->usgFmt_).maxAltInDocs_;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  (this->usgFmt_).maxAltInUsage_ = iVar2;
  return;
}

Assistant:

documentation(const group& cli,
                  const doc_formatting& fmt = doc_formatting{},
                  filter_function filter = param_filter{})
    :
        cli_(cli), fmt_{fmt}, usgFmt_{fmt}, filter_{std::move(filter)}
    {
        //necessary, because we re-use "usage_lines" to generate
        //labels for documented groups
        usgFmt_.max_flags_per_param_in_usage(
            usgFmt_.max_flags_per_param_in_doc());
    }